

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

void __thiscall Node::SmoothTypes(Node *this,Node *DefaultType)

{
  VARTYPE VVar1;
  int iVar2;
  Node *pNVar3;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [48];
  string local_40 [32];
  VARTYPE local_20;
  byte local_19;
  VARTYPE rawtype;
  bool actualtype;
  Node *DefaultType_local;
  Node *this_local;
  
  local_19 = 0;
  _rawtype = DefaultType;
  DefaultType_local = this;
  if (this->Tree[1] == (Node *)0x0) {
    if (DefaultType == (Node *)0x0) {
      if (this->Tree[0] == (Node *)0x0) {
        pNVar3 = (Node *)operator_new(0x70);
        iVar2 = UnguessVarType(VARTYPE_NONE);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"",&local_e1);
        Node(pNVar3,iVar2,(string *)local_e0,0,0);
        this->Tree[1] = pNVar3;
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
      else {
        pNVar3 = (Node *)operator_new(0x70);
        local_ba = 1;
        std::__cxx11::string::string(local_98,(string *)&this->Tree[0]->TextValue);
        VVar1 = GuessVarType((string *)local_98);
        iVar2 = UnguessVarType(VVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"",&local_b9);
        Node(pNVar3,iVar2,(string *)local_b8,0,0);
        local_ba = 0;
        this->Tree[1] = pNVar3;
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        std::__cxx11::string::~string(local_98);
      }
    }
    else {
      std::__cxx11::string::string(local_40,(string *)&this->Tree[0]->TextValue);
      VVar1 = GuessVarType((string *)local_40);
      std::__cxx11::string::~string(local_40);
      local_20 = VVar1;
      if (VVar1 == VARTYPE_REAL) {
        pNVar3 = (Node *)operator_new(0x70);
        Node(pNVar3,_rawtype);
        this->Tree[1] = pNVar3;
      }
      else {
        pNVar3 = (Node *)operator_new(0x70);
        local_72 = 1;
        iVar2 = UnguessVarType(local_20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,"",&local_71);
        Node(pNVar3,iVar2,(string *)local_70,0,0);
        local_72 = 0;
        this->Tree[1] = pNVar3;
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
    }
  }
  else {
    local_19 = 1;
  }
  if (this->Block[0] != (Node *)0x0) {
    if ((local_19 & 1) == 0) {
      SmoothTypes(this->Block[0],_rawtype);
    }
    else {
      SmoothTypes(this->Block[0],this->Tree[1]);
    }
  }
  return;
}

Assistant:

void Node::SmoothTypes(
	Node* DefaultType	/**< Node that defines the default types */
)
{
	bool actualtype = false;

	if (Tree[1] == 0)
	{
		//
		// Fake up a defintion for this segment since we dont have
		// on entered directly on this line.
		//
		if (DefaultType != 0)
		{
			VARTYPE rawtype = GuessVarType(Tree[0]->TextValue);
			if (rawtype == VARTYPE_REAL)
			{
				Tree[1] = new Node(*DefaultType);
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(rawtype));
			}
		}
		else
		{
			if (Tree[0] != 0)
			{
				Tree[1] = new Node(UnguessVarType(
					GuessVarType(Tree[0]->TextValue)));
			}
			else
			{
				Tree[1] = new Node(UnguessVarType(VARTYPE_NONE));
			}
		}
	}
	else
	{
		//
		// We need to keep track of weither we have been given
		// an actual definition on this segment, or if we have
		// faked one up.
		//
		actualtype = true;
	}

	if (Block[0] != 0)
	{
		//
		// If we have an actual type here, use it, else use
		// what came from a previous segment
		//
		if (actualtype)
		{
			Block[0]->SmoothTypes(Tree[1]);
		}
		else
		{
			Block[0]->SmoothTypes(DefaultType);
		}
	}
}